

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  Edition *pEVar6;
  long lVar7;
  
  iVar1 = this->m_editions_size;
  if (this->m_editions_count < iVar1) {
    return true;
  }
  iVar4 = 1;
  if (iVar1 != 0) {
    iVar4 = iVar1 * 2;
  }
  lVar3 = (long)iVar4 * 0x10;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar5 = lVar3 + 8;
  }
  plVar2 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
  if (plVar2 == (long *)0x0) {
    return false;
  }
  *plVar2 = (long)iVar4;
  lVar7 = 0;
  pEVar6 = (Edition *)(plVar2 + 1);
  do {
    Edition::Edition(pEVar6);
    lVar7 = lVar7 + -0x10;
    pEVar6 = pEVar6 + 1;
  } while (-lVar7 != lVar3);
  iVar1 = this->m_editions_count;
  pEVar6 = this->m_editions;
  if ((long)iVar1 < 1) {
    if (pEVar6 == (Edition *)0x0) goto LAB_0015d9c3;
  }
  else {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)plVar2 + lVar3 + 8) = *(undefined8 *)((long)&pEVar6->m_atoms + lVar3);
      *(undefined8 *)((long)plVar2 + lVar3 + 0x10) =
           *(undefined8 *)((long)&pEVar6->m_atoms_size + lVar3);
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
  }
  lVar3._0_4_ = pEVar6[-1].m_atoms_size;
  lVar3._4_4_ = pEVar6[-1].m_atoms_count;
  if (lVar3 != 0) {
    lVar3 = lVar3 << 4;
    do {
      Edition::~Edition((Edition *)((long)&pEVar6[-1].m_atoms + lVar3));
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
  }
  operator_delete__(&pEVar6[-1].m_atoms_size);
LAB_0015d9c3:
  this->m_editions = (Edition *)(plVar2 + 1);
  this->m_editions_size = iVar4;
  return true;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}